

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

void wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>::scan
               (Replacer *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_> *pPVar6;
  _func_void_Replacer_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    pPVar6 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitBlock,currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
      goto LAB_007a5806;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) {
LAB_007a5489:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
                  (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case IfId:
    pPVar6 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitIf,currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_007a5806;
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
                     super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                     super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_007a53ce;
  case LoopId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitLoop,currp);
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_007a5806;
    }
    goto LAB_007a5030;
  case BreakId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitBreak,currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_007a5806;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
                     super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                     super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_007a4c45;
  case SwitchId:
    pPVar6 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitSwitch,currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_007a5806;
    }
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar5 = *(long *)(pEVar1 + 4);
    goto joined_r0x007a49d3;
  case CallId:
    pPVar6 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitCall,currp);
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_007a5806;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_007a5489;
        Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
                  (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case CallIndirectId:
    pPVar6 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitCallIndirect,currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_007a5806;
    }
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (*(ulong *)(pEVar1 + 2) <= lVar4 - 2U) goto LAB_007a5489;
        Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
                  (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
                   (Expression **)(pEVar1[1].type.id + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case LocalGetId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitLocalGet,currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_007a5806;
    }
    break;
  case LocalSetId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitLocalSet,currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_007a5806;
    }
    goto LAB_007a5132;
  case GlobalGetId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitGlobalGet,currp);
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_007a5806;
    }
    break;
  case GlobalSetId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitGlobalSet,currp);
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_007a5806;
    }
    goto LAB_007a5030;
  case LoadId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitLoad,currp);
    if (pEVar1->_id == LoadId) {
      pEVar1 = pEVar1 + 3;
      goto LAB_007a53ce;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::Load]";
    goto LAB_007a5806;
  case StoreId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStore,currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_007a5806;
    }
    goto LAB_007a50f7;
  case ConstId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitConst,currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_007a5806;
    }
    break;
  case UnaryId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitUnary,currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_007a5806;
    }
    goto LAB_007a5132;
  case BinaryId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitBinary,currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_007a5806;
    }
    goto LAB_007a53ae;
  case SelectId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitSelect,currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_007a5806;
    }
    goto LAB_007a4d24;
  case DropId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitDrop,currp);
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_007a5806;
    }
    goto LAB_007a5382;
  case ReturnId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitReturn,currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_007a5806;
    }
    goto LAB_007a49ca;
  case MemorySizeId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitMemorySize,currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_007a5806;
    }
    break;
  case MemoryGrowId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitMemoryGrow,currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_007a5806;
    }
    goto LAB_007a5382;
  case NopId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitNop,currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_007a5806;
    }
    break;
  case UnreachableId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitUnreachable,currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_007a5806;
    }
    break;
  case AtomicRMWId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitAtomicRMW,currp);
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_007a5806;
    }
    goto LAB_007a51dd;
  case AtomicCmpxchgId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitAtomicCmpxchg,currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_007a5806;
    }
    goto LAB_007a51c3;
  case AtomicWaitId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitAtomicWait,currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_007a5806;
    }
    goto LAB_007a4851;
  case AtomicNotifyId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitAtomicNotify,currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_007a5806;
    }
    goto LAB_007a53ae;
  case AtomicFenceId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitAtomicFence,currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_007a5806;
    }
    break;
  case SIMDExtractId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitSIMDExtract,currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_007a5806;
    }
    goto LAB_007a5132;
  case SIMDReplaceId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitSIMDReplace,currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_007a5806;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_007a53b9;
  case SIMDShuffleId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitSIMDShuffle,currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_007a5806;
    }
    goto LAB_007a5320;
  case SIMDTernaryId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitSIMDTernary,currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_007a5806;
    }
    goto LAB_007a4851;
  case SIMDShiftId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitSIMDShift,currp);
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_007a5806;
    }
    goto LAB_007a53ae;
  case SIMDLoadId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitSIMDLoad,currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_007a5806;
    }
    goto LAB_007a4f59;
  case SIMDLoadStoreLaneId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitSIMDLoadStoreLane,currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_007a5806;
    }
LAB_007a50f7:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_007a53ce;
  case MemoryInitId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitMemoryInit,currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_007a5806;
    }
LAB_007a51c3:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_007a51dd;
  case DataDropId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitDataDrop,currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_007a5806;
    }
    break;
  case MemoryCopyId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitMemoryCopy,currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_007a5806;
    }
    goto LAB_007a4d24;
  case MemoryFillId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitMemoryFill,currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_007a5806;
    }
    goto LAB_007a4d24;
  case PopId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitPop,currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_007a5806;
    }
    break;
  case RefNullId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitRefNull,currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_007a5806;
    }
    break;
  case RefIsNullId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitRefIsNull,currp);
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_007a5806;
    }
    goto LAB_007a5382;
  case RefFuncId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitRefFunc,currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_007a5806;
    }
    break;
  case RefEqId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitRefEq,currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_007a5806;
    }
    goto LAB_007a5320;
  case TableGetId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitTableGet,currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_007a5806;
    }
    goto LAB_007a5030;
  case TableSetId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitTableSet,currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_007a5806;
    }
    goto LAB_007a51dd;
  case TableSizeId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitTableSize,currp);
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_007a5806;
    }
    break;
  case TableGrowId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitTableGrow,currp);
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_007a5806;
    }
LAB_007a51dd:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_007a53ce;
  case TryId:
    pPVar6 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitTry,currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_007a5806;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (*(ulong *)(pEVar1 + 5) <= lVar4 - 2U) goto LAB_007a5489;
        Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
                  (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
                   (Expression **)(pEVar1[4].type.id + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
LAB_007a5030:
    pEVar1 = pEVar1 + 2;
    goto LAB_007a53ce;
  case ThrowId:
    pPVar6 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitThrow,currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_007a5806;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) goto LAB_007a5489;
        Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
                  (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case RethrowId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitRethrow,currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_007a5806;
    }
    break;
  case TupleMakeId:
    pPVar6 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitTupleMake,currp);
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_007a5806;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_007a5489;
        Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
                  (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case TupleExtractId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitTupleExtract,currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_007a5806;
    }
    goto LAB_007a5382;
  case I31NewId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitI31New,currp);
    if (pEVar1->_id != I31NewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31New]";
      goto LAB_007a5806;
    }
    goto LAB_007a5382;
  case I31GetId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitI31Get,currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_007a5806;
    }
    goto LAB_007a5382;
  case CallRefId:
    pPVar6 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitCallRef,currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_007a5806;
    }
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_007a5489;
        Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
                  (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case RefTestId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitRefTest,currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_007a5806;
    }
    goto LAB_007a5382;
  case RefCastId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitRefCast,currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_007a5806;
    }
    goto LAB_007a5382;
  case BrOnId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitBrOn,currp);
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_007a5806;
    }
LAB_007a4f59:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_007a53ce;
  case StructNewId:
    pPVar6 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStructNew,currp);
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_007a5806;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_007a5489;
        Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
                  (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case StructGetId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStructGet,currp);
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_007a5806;
    }
    goto LAB_007a5132;
  case StructSetId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStructSet,currp);
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_007a5806;
    }
    goto LAB_007a53ae;
  case ArrayNewId:
    pPVar6 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitArrayNew,currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_007a5806;
    }
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)&pEVar1[1].type);
LAB_007a49ca:
    local_38 = pEVar1 + 1;
    lVar5 = *(long *)(pEVar1 + 1);
joined_r0x007a49d3:
    if (lVar5 != 0) {
LAB_007a4c45:
      local_40 = scan;
      SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
                     super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                     super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    break;
  case ArrayNewSegId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitArrayNewSeg,currp);
    if (pEVar1->_id != ArrayNewSegId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewSeg]";
      goto LAB_007a5806;
    }
    goto LAB_007a4a7a;
  case ArrayNewFixedId:
    pPVar6 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitArrayNewFixed,currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_007a5806;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_007a5489;
        Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
                  (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case ArrayGetId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitArrayGet,currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_007a5806;
    }
    goto LAB_007a5320;
  case ArraySetId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitArraySet,currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_007a5806;
    }
    goto LAB_007a4d24;
  case ArrayLenId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitArrayLen,currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_007a5806;
    }
    goto LAB_007a5382;
  case ArrayCopyId:
    pPVar6 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitArrayCopy,currp);
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_007a5806;
    }
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_007a47eb;
  case ArrayFillId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitArrayFill,currp);
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_007a5806;
    }
LAB_007a47eb:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    goto LAB_007a4d24;
  case ArrayInitId:
    pPVar6 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitArrayInit,currp);
    if (pEVar1->_id != ArrayInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInit]";
      goto LAB_007a5806;
    }
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)(pEVar1 + 4));
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)&pEVar1[3].type);
LAB_007a4a7a:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_007a53ce;
  case RefAsId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitRefAs,currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_007a5806;
    }
    goto LAB_007a5132;
  case StringNewId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringNew,currp);
    if (pEVar1->_id == StringNewId) {
      local_38 = pEVar1 + 3;
      local_40 = scan;
      if (*(long *)(pEVar1 + 3) != 0) {
        SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                       ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                       super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>.stack,&local_40,
                   (Expression ***)&local_38);
      }
      local_38 = (Expression *)&pEVar1[2].type;
      local_40 = scan;
      if (pEVar1[2].type.id != 0) {
        SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                       ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                       super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>.stack,&local_40,
                   (Expression ***)&local_38);
      }
      local_38 = pEVar1 + 2;
      local_40 = scan;
      if (*(long *)(pEVar1 + 2) != 0) {
        SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                       ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                       super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>.stack,&local_40,
                   (Expression ***)&local_38);
      }
      pEVar1 = (Expression *)&pEVar1[1].type;
      goto LAB_007a53ce;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
    goto LAB_007a5806;
  case StringConstId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringConst,currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_007a5806;
    }
    break;
  case StringMeasureId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringMeasure,currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_007a5806;
    }
    goto LAB_007a5132;
  case StringEncodeId:
    pPVar6 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringEncode,currp);
    if (pEVar1->_id == StringEncodeId) {
      local_38 = (Expression *)&pEVar1[2].type;
      local_40 = scan;
      if (pEVar1[2].type.id != 0) {
        SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                       ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                       super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>.stack,&local_40,
                   (Expression ***)&local_38);
      }
      Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
                (&pPVar6->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
                 (Expression **)(pEVar1 + 2));
      pEVar1 = (Expression *)&pEVar1[1].type;
      goto LAB_007a53ce;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
LAB_007a5806:
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                  ,0x314,__function);
  case StringConcatId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringConcat,currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_007a5806;
    }
    goto LAB_007a5320;
  case StringEqId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringEq,currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_007a5806;
    }
    goto LAB_007a53ae;
  case StringAsId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringAs,currp);
    if (pEVar1->_id != StringAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringAs]";
      goto LAB_007a5806;
    }
LAB_007a5132:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_007a53ce;
  case StringWTF8AdvanceId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringWTF8Advance,currp);
    if (pEVar1->_id != StringWTF8AdvanceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF8Advance]";
      goto LAB_007a5806;
    }
LAB_007a4d24:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)(pEVar1 + 2));
    goto LAB_007a5320;
  case StringWTF16GetId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringWTF16Get,currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_007a5806;
    }
    goto LAB_007a5320;
  case StringIterNextId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringIterNext,currp);
    if (pEVar1->_id != StringIterNextId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterNext]";
      goto LAB_007a5806;
    }
LAB_007a5382:
    pEVar1 = pEVar1 + 1;
LAB_007a53ce:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,(Expression **)pEVar1);
    return;
  case StringIterMoveId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringIterMove,currp);
    if (pEVar1->_id != StringIterMoveId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterMove]";
      goto LAB_007a5806;
    }
LAB_007a53ae:
    currp_00 = pEVar1 + 2;
LAB_007a53b9:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,(Expression **)currp_00)
    ;
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_007a53ce;
  case StringSliceWTFId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringSliceWTF,currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_007a5806;
    }
LAB_007a4851:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_007a53b9;
  case StringSliceIterId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringSliceIter,currp);
    if (pEVar1->_id != StringSliceIterId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceIter]";
      goto LAB_007a5806;
    }
LAB_007a5320:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_007a53ce;
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }